

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::read_content<httplib::Request>(Stream *strm,Request *x,Progress *progress)

{
  int iVar1;
  uint uVar2;
  const_iterator cVar3;
  char *__s1;
  pointer pcVar4;
  pointer pcVar5;
  bool bVar6;
  pointer local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  undefined1 local_50 [8];
  char byte;
  char local_40 [16];
  
  iVar1 = get_header_value_int(&x->headers,"Content-Length",0);
  if (iVar1 == 0) {
    local_50 = (undefined1  [8])local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Transfer-Encoding","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(x->headers)._M_t,(key_type *)local_50);
    if (local_50 != (undefined1  [8])local_40) {
      operator_delete((void *)local_50);
    }
    if ((_Rb_tree_header *)cVar3._M_node == &(x->headers)._M_t._M_impl.super__Rb_tree_header) {
      __s1 = "";
    }
    else {
      __s1 = *(char **)(cVar3._M_node + 2);
    }
    iVar1 = strcasecmp(__s1,"chunked");
    if (iVar1 == 0) {
      bVar6 = read_content_chunked(strm,&x->body);
    }
    else {
      iVar1 = (*strm->_vptr_Stream[2])(strm,local_50,1);
      if (0 < iVar1) {
        do {
          std::__cxx11::string::push_back((char)&x->body);
          iVar1 = (*strm->_vptr_Stream[2])(strm,local_50,1);
        } while (0 < iVar1);
      }
      bVar6 = -1 < iVar1;
    }
  }
  else {
    pcVar4 = (pointer)(long)iVar1;
    std::function<void_(unsigned_long,_unsigned_long)>::function
              ((function<void_(unsigned_long,_unsigned_long)> *)&local_70,progress);
    std::__cxx11::string::_M_replace_aux((ulong)&x->body,0,(x->body)._M_string_length,(char)iVar1);
    pcVar5 = (pointer)0x0;
    do {
      uVar2 = (*strm->_vptr_Stream[2])
                        (strm,pcVar5 + (long)(x->body)._M_dataplus._M_p,(long)pcVar4 - (long)pcVar5)
      ;
      bVar6 = 0 < (int)uVar2;
      if ((int)uVar2 < 1) break;
      pcVar5 = pcVar5 + uVar2;
      if (local_60 != (code *)0x0) {
        local_78 = pcVar4;
        local_50 = (undefined1  [8])pcVar5;
        (*local_58)(&local_70,(unsigned_long *)local_50,(unsigned_long *)&local_78);
      }
    } while (pcVar5 < pcVar4);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
  }
  return bVar6;
}

Assistant:

bool read_content(Stream& strm, T& x, Progress progress = Progress())
{
    auto len = get_header_value_int(x.headers, "Content-Length", 0);

    if (len) {
        return read_content_with_length(strm, x.body, len, progress);
    } else {
        const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", "");

        if (!strcasecmp(encoding, "chunked")) {
            return read_content_chunked(strm, x.body);
        } else {
            return read_content_without_length(strm, x.body);
        }
    }

    return true;
}